

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# model.cpp
# Opt level: O0

void __thiscall model::updateW(model *this,uint i)

{
  float fVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  reference pvVar6;
  size_t *in_RCX;
  uchar *sig;
  EVP_PKEY_CTX *ctx;
  vector<float,_std::allocator<float>_> *this_00;
  uchar *in_R8;
  size_t in_R9;
  float extraout_XMM0_Da;
  float extraout_XMM0_Da_00;
  double dVar7;
  uint i_local;
  model *this_local;
  
  this_00 = &this->z;
  std::vector<float,_std::allocator<float>_>::operator[](this_00,(ulong)i);
  std::abs((int)this_00);
  if (this->lambda1 < extraout_XMM0_Da) {
    pvVar6 = std::vector<float,_std::allocator<float>_>::operator[](&this->z,(ulong)i);
    fVar1 = *pvVar6;
    ctx = (EVP_PKEY_CTX *)(ulong)i;
    std::vector<float,_std::allocator<float>_>::operator[](&this->z,(size_type)ctx);
    sign(this,ctx,sig,in_RCX,in_R8,in_R9);
    fVar2 = this->lambda1;
    fVar3 = this->beta;
    pvVar6 = std::vector<float,_std::allocator<float>_>::operator[](&this->n,(ulong)i);
    dVar7 = std::sqrt((double)(ulong)(uint)*pvVar6);
    fVar4 = this->alpha;
    fVar5 = this->lambda2;
    pvVar6 = std::vector<float,_std::allocator<float>_>::operator[](&this->w,(ulong)i);
    *pvVar6 = -(-extraout_XMM0_Da_00 * fVar2 + fVar1) / ((fVar3 + SUB84(dVar7,0)) / fVar4 + fVar5);
  }
  else {
    pvVar6 = std::vector<float,_std::allocator<float>_>::operator[](&this->w,(ulong)i);
    *pvVar6 = 0.0;
  }
  return;
}

Assistant:

void model::updateW(unsigned int i) {
    if (abs(z[i]) <= lambda1) {
        w[i] = 0;
    } else {
        w[i] = -(z[i] - sign(z[i]) * lambda1) / ((beta + sqrt(n[i])) / alpha + lambda2);
    }
}